

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

Aig_Tru_t ** Aig_RManTableLookup(Aig_RMan_t *p,uint *pTruth,int nVars)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  Aig_Tru_t *pAVar5;
  ulong uVar6;
  Aig_Tru_t *pAVar7;
  int iVar8;
  
  uVar2 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar2 = 1;
  }
  if ((int)uVar2 < 1) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 ^ Aig_RManTableLookup::s_Primes[(uint)uVar6 & 0xf] * pTruth[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  pAVar7 = (Aig_Tru_t *)(p->pBins + (int)(uVar4 % (uint)p->nBins));
  do {
    pAVar5 = pAVar7;
    pAVar7 = pAVar7->pNext;
    uVar6 = (ulong)uVar2;
    if (pAVar7 == (Aig_Tru_t *)0x0) {
      return &pAVar5->pNext;
    }
    do {
      iVar8 = (int)uVar6;
      if (iVar8 < 1) {
        return &pAVar5->pNext;
      }
      lVar1 = uVar6 * 4;
      lVar3 = uVar6 - 1;
      uVar6 = uVar6 - 1;
    } while (*(uint *)(&pAVar7->field_0xc + lVar1) == pTruth[lVar3]);
  } while (0 < iVar8);
  return &pAVar5->pNext;
}

Assistant:

Aig_Tru_t ** Aig_RManTableLookup( Aig_RMan_t * p, unsigned * pTruth, int nVars )
{
    static int s_Primes[16] = { 
        1291, 1699, 1999, 2357, 2953, 3313, 3907, 4177, 
        4831, 5147, 5647, 6343, 6899, 7103, 7873, 8147 };
    Aig_Tru_t ** ppSpot, * pEntry;
    ppSpot = p->pBins + Aig_RManTableHash( pTruth, nVars, p->nBins, s_Primes );
    for ( pEntry = *ppSpot; pEntry; ppSpot = &pEntry->pNext, pEntry = pEntry->pNext )
        if ( Kit_TruthIsEqual( pEntry->pTruth, pTruth, nVars ) )
            return ppSpot;
    return ppSpot;
}